

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  SizeType count;
  
  is->src_ = is->src_ + 1;
  bVar2 = VWReaderHandler<true>::StartObject(handler);
  if (bVar2) {
    SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*is->src_ == '}') {
      is->src_ = is->src_ + 1;
      count = 0;
    }
    else {
      count = 1;
      while( true ) {
        if (*is->src_ != '\"') {
          lVar3 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 4;
          goto LAB_001993cd;
        }
        ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar1 = is->src_;
        if (*pcVar1 != ':') {
          lVar3 = (long)pcVar1 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_001993cd;
        }
        is->src_ = pcVar1 + 1;
        SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar1 = is->src_;
        if (*pcVar1 != ',') break;
        is->src_ = pcVar1 + 1;
        SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
        count = count + 1;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      }
      if (*pcVar1 != '}') {
        lVar3 = (long)pcVar1 - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 6;
        goto LAB_001993cd;
      }
      is->src_ = pcVar1 + 1;
    }
    bVar2 = VWReaderHandler<true>::EndObject(handler,count);
    if (bVar2) {
      return;
    }
  }
  lVar3 = (long)is->src_ - (long)is->head_;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_001993cd:
  *(long *)(this + 0x38) = lVar3;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }